

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

StructUnionMemberSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::StructUnionMemberSyntax,slang::syntax::StructUnionMemberSyntax_const&>
          (BumpAllocator *this,StructUnionMemberSyntax *args)

{
  SyntaxNode *pSVar1;
  size_t sVar2;
  Info *pIVar3;
  undefined4 uVar4;
  undefined1 uVar5;
  NumericTokenFlags NVar6;
  uint32_t uVar7;
  StructUnionMemberSyntax *pSVar8;
  
  pSVar8 = (StructUnionMemberSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((StructUnionMemberSyntax *)this->endPtr < pSVar8 + 1) {
    pSVar8 = (StructUnionMemberSyntax *)allocateSlow(this,0xb0,8);
  }
  else {
    this->head->current = (byte *)(pSVar8 + 1);
  }
  (pSVar8->super_SyntaxNode).previewNode = (args->super_SyntaxNode).previewNode;
  uVar4 = *(undefined4 *)&(args->super_SyntaxNode).field_0x4;
  pSVar1 = (args->super_SyntaxNode).parent;
  (pSVar8->super_SyntaxNode).kind = (args->super_SyntaxNode).kind;
  *(undefined4 *)&(pSVar8->super_SyntaxNode).field_0x4 = uVar4;
  (pSVar8->super_SyntaxNode).parent = pSVar1;
  uVar4 = *(undefined4 *)&(args->attributes).super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->attributes).super_SyntaxListBase.super_SyntaxNode.parent;
  (pSVar8->attributes).super_SyntaxListBase.super_SyntaxNode.kind =
       (args->attributes).super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)&(pSVar8->attributes).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar4;
  (pSVar8->attributes).super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pSVar8->attributes).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->attributes).super_SyntaxListBase.super_SyntaxNode.previewNode;
  (pSVar8->attributes).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_00c8c940;
  (pSVar8->attributes).super_SyntaxListBase.childCount =
       (args->attributes).super_SyntaxListBase.childCount;
  sVar2 = (args->attributes).
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  (pSVar8->attributes).super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.
  _M_ptr = (args->attributes).
           super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
  (pSVar8->attributes).super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.
  _M_extent._M_extent_value = sVar2;
  (pSVar8->attributes).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_00c8c880;
  (pSVar8->type).ptr = (args->type).ptr;
  uVar5 = (args->randomQualifier).field_0x2;
  NVar6.raw = (args->randomQualifier).numFlags.raw;
  uVar7 = (args->randomQualifier).rawLen;
  pIVar3 = (args->randomQualifier).info;
  (pSVar8->randomQualifier).kind = (args->randomQualifier).kind;
  (pSVar8->randomQualifier).field_0x2 = uVar5;
  (pSVar8->randomQualifier).numFlags = (NumericTokenFlags)NVar6.raw;
  (pSVar8->randomQualifier).rawLen = uVar7;
  (pSVar8->randomQualifier).info = pIVar3;
  uVar4 = *(undefined4 *)&(args->declarators).super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->declarators).super_SyntaxListBase.super_SyntaxNode.parent;
  (pSVar8->declarators).super_SyntaxListBase.super_SyntaxNode.kind =
       (args->declarators).super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)&(pSVar8->declarators).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar4;
  (pSVar8->declarators).super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pSVar8->declarators).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->declarators).super_SyntaxListBase.super_SyntaxNode.previewNode;
  (pSVar8->declarators).super_SyntaxListBase.childCount =
       (args->declarators).super_SyntaxListBase.childCount;
  (pSVar8->declarators).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_00c95328;
  sVar2 = (args->declarators).elements._M_extent._M_extent_value;
  (pSVar8->declarators).elements._M_ptr = (args->declarators).elements._M_ptr;
  (pSVar8->declarators).elements._M_extent._M_extent_value = sVar2;
  uVar5 = (args->semi).field_0x2;
  NVar6.raw = (args->semi).numFlags.raw;
  uVar7 = (args->semi).rawLen;
  pIVar3 = (args->semi).info;
  (pSVar8->semi).kind = (args->semi).kind;
  (pSVar8->semi).field_0x2 = uVar5;
  (pSVar8->semi).numFlags = (NumericTokenFlags)NVar6.raw;
  (pSVar8->semi).rawLen = uVar7;
  (pSVar8->semi).info = pIVar3;
  return pSVar8;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }